

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O1

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,exception_ptr exception)

{
  long lVar1;
  void *pvVar2;
  QUnhandledExceptionPrivate *pQVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->super_QException = (QException)&PTR__QUnhandledException_006af598;
  pQVar3 = (QUnhandledExceptionPrivate *)operator_new(0x10);
  pvVar2 = *exception._M_exception_object;
  if (pvVar2 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  (pQVar3->exceptionPtr)._M_exception_object = pvVar2;
  if (pvVar2 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  (this->d).d.ptr = pQVar3;
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  if (pvVar2 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(std::exception_ptr exception) noexcept
    : d(new QUnhandledExceptionPrivate(exception))
{
}